

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

void Abc_AigAndDelete(Abc_Aig_t *pMan,Abc_Obj_t *pThis)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *p1;
  Abc_Obj_t **ppAStack_38;
  uint Key;
  Abc_Obj_t **ppPlace;
  Abc_Obj_t *pAnd1;
  Abc_Obj_t *pAnd0;
  Abc_Obj_t *pAnd;
  Abc_Obj_t *pThis_local;
  Abc_Aig_t *pMan_local;
  
  iVar1 = Abc_ObjIsComplement(pThis);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pThis)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                  ,0x222,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsNode(pThis);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pThis)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                  ,0x223,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjFaninNum(pThis);
  if (iVar1 != 2) {
    __assert_fail("Abc_ObjFaninNum(pThis) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                  ,0x224,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  if (pMan->pNtkAig != pThis->pNtk) {
    __assert_fail("pMan->pNtkAig == pThis->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                  ,0x225,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  pAVar3 = Abc_ObjChild0(pThis);
  Abc_ObjRegular(pAVar3);
  pAVar3 = Abc_ObjChild1(pThis);
  Abc_ObjRegular(pAVar3);
  pAVar3 = Abc_ObjChild0(pThis);
  p1 = Abc_ObjChild1(pThis);
  uVar2 = Abc_HashKey2(pAVar3,p1,pMan->nBins);
  ppAStack_38 = pMan->pBins + uVar2;
  pAnd0 = pMan->pBins[uVar2];
  do {
    if (pAnd0 == (Abc_Obj_t *)0x0) {
LAB_00acde9b:
      if (pAnd0 == pThis) {
        pMan->nEntries = pMan->nEntries + -1;
        if (pThis->pNtk->pManCut != (void *)0x0) {
          Abc_NodeFreeCuts(pThis->pNtk->pManCut,pThis);
        }
        return;
      }
      __assert_fail("pAnd == pThis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                    ,0x236,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
    }
    if (pAnd0 == pThis) {
      *ppAStack_38 = pAnd0->pNext;
      goto LAB_00acde9b;
    }
    ppAStack_38 = &pAnd0->pNext;
    pAnd0 = pAnd0->pNext;
  } while( true );
}

Assistant:

void Abc_AigAndDelete( Abc_Aig_t * pMan, Abc_Obj_t * pThis )
{
    Abc_Obj_t * pAnd, * pAnd0, * pAnd1, ** ppPlace;
    unsigned Key;
    assert( !Abc_ObjIsComplement(pThis) );
    assert( Abc_ObjIsNode(pThis) );
    assert( Abc_ObjFaninNum(pThis) == 2 );
    assert( pMan->pNtkAig == pThis->pNtk );
    // get the hash key for these two nodes
    pAnd0 = Abc_ObjRegular( Abc_ObjChild0(pThis) );
    pAnd1 = Abc_ObjRegular( Abc_ObjChild1(pThis) );
    Key = Abc_HashKey2( Abc_ObjChild0(pThis), Abc_ObjChild1(pThis), pMan->nBins );
    // find the matching node in the table
    ppPlace = pMan->pBins + Key;
    Abc_AigBinForEachEntry( pMan->pBins[Key], pAnd )
    {
        if ( pAnd != pThis )
        {
            ppPlace = &pAnd->pNext;
            continue;
        }
        *ppPlace = pAnd->pNext;
        break;
    }
    assert( pAnd == pThis );
    pMan->nEntries--;
    // delete the cuts if defined
    if ( pThis->pNtk->pManCut )
        Abc_NodeFreeCuts( pThis->pNtk->pManCut, pThis );
}